

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,float power)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  ImVec2 IVar5;
  double dVar6;
  bool local_9f;
  int local_98;
  double v_cur_norm_curved;
  double v_new_norm_curved;
  double v_old_norm_curved;
  double dStack_70;
  bool is_power;
  double v_old_ref_for_accum_remainder;
  longlong v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  float local_50;
  int decimal_precision;
  float adjust_delta;
  bool has_min_max;
  ImGuiContext *g;
  float power_local;
  char *format_local;
  longlong v_max_local;
  longlong v_min_local;
  float v_speed_local;
  longlong *v_local;
  ImGuiDataType data_type_local;
  
  pIVar1 = GImGui;
  bVar3 = v_min != v_max;
  v_min_local._4_4_ = v_speed;
  if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar3)) {
    v_min_local._4_4_ = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  local_50 = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (1.0 < (pIVar1->IO).MouseDragMaxDistanceSqr[0])) {
    local_50 = (pIVar1->IO).MouseDelta.x;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      local_50 = local_50 * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      local_50 = local_50 * 10.0;
    }
  }
  if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((data_type == 4) || (data_type == 5)) {
      local_98 = ImParseFormatPrecision(format,3);
    }
    else {
      local_98 = 0;
    }
    IVar5 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
    v_cur._4_4_ = IVar5.x;
    local_50 = v_cur._4_4_;
    fVar4 = GetMinimumStepAtDecimalPrecision(local_98);
    v_min_local._4_4_ = ImMax<float>(v_min_local._4_4_,fVar4);
  }
  local_50 = v_min_local._4_4_ * local_50;
  local_9f = false;
  if ((bVar3) && ((*v < v_max || (local_9f = true, local_50 <= 0.0)))) {
    local_9f = *v <= v_min && local_50 < 0.0;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) != 0) || (local_9f)) {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  else if ((local_50 != 0.0) || (NAN(local_50))) {
    pIVar1->DragCurrentAccum = local_50 + pIVar1->DragCurrentAccum;
    pIVar1->DragCurrentAccumDirty = true;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    v_local._7_1_ = false;
  }
  else {
    dStack_70 = 0.0;
    bVar2 = false;
    if (((power != 1.0) || (NAN(power))) && ((data_type == 4 || (bVar2 = false, data_type == 5)))) {
      bVar2 = bVar3;
    }
    if (bVar2) {
      dStack_70 = ImPow((double)(*v - v_min) / (double)(v_max - v_min),1.0 / (double)power);
      fVar4 = ImSaturate((float)(dStack_70 +
                                (double)(pIVar1->DragCurrentAccum / (float)(v_max - v_min))));
      fVar4 = ImPow(fVar4,power);
      v_old_ref_for_accum_remainder = (double)(v_min + (long)fVar4 * (v_max - v_min));
    }
    else {
      v_old_ref_for_accum_remainder = (double)((long)pIVar1->DragCurrentAccum + *v);
    }
    v_old_ref_for_accum_remainder =
         (double)RoundScalarWithFormat<long_long,long_long>
                           (format,data_type,(longlong)v_old_ref_for_accum_remainder);
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar2) {
      dVar6 = ImPow((double)((long)v_old_ref_for_accum_remainder - v_min) / (double)(v_max - v_min),
                    1.0 / (double)power);
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(dVar6 - dStack_70);
    }
    else {
      pIVar1->DragCurrentAccum =
           pIVar1->DragCurrentAccum - (float)((long)v_old_ref_for_accum_remainder - *v);
    }
    if (v_old_ref_for_accum_remainder == 0.0) {
      v_old_ref_for_accum_remainder = 0.0;
    }
    if (((double)*v != v_old_ref_for_accum_remainder) && (bVar3)) {
      if (((long)v_old_ref_for_accum_remainder < v_min) ||
         ((*v < (long)v_old_ref_for_accum_remainder && (local_50 < 0.0)))) {
        v_old_ref_for_accum_remainder = (double)v_min;
      }
      if ((v_max < (long)v_old_ref_for_accum_remainder) ||
         (((long)v_old_ref_for_accum_remainder < *v && (0.0 < local_50)))) {
        v_old_ref_for_accum_remainder = (double)v_max;
      }
    }
    if ((double)*v == v_old_ref_for_accum_remainder) {
      v_local._7_1_ = false;
    }
    else {
      *v = (longlong)v_old_ref_for_accum_remainder;
      v_local._7_1_ = true;
    }
  }
  return v_local._7_1_;
}

Assistant:

static bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power)
{
    ImGuiContext& g = *GImGui;

    // Default tweak speed
    bool has_min_max = (v_min != v_max) && (v_max - v_max < FLT_MAX);
    if (v_speed == 0.0f && has_min_max)
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta.x;
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f/100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard|ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f/10.0f, 10.0f).x;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    const bool is_power = (power != 1.0f && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) && has_min_max);
    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormat<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (handle overflow/wrap-around)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}